

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> * __thiscall
llbuild::basic::StringList::getValues
          (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__return_storage_ptr__,
          StringList *this)

{
  ulong uVar1;
  ulong uVar2;
  StringRef value;
  
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    uVar1 = this->size;
    if (uVar1 <= uVar2) {
      return __return_storage_ptr__;
    }
    value.Data = this->contents + uVar2;
    if (this->contents == (char *)0x0) {
      value.Length = 0;
    }
    else {
      value.Length = strlen(value.Data);
    }
    if (uVar1 < value.Length + uVar2) break;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (__return_storage_ptr__,&value);
    uVar2 = uVar2 + value.Length + 1;
  }
  __assert_fail("i + value.size() <= size",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                ,0x5d,"std::vector<StringRef> llbuild::basic::StringList::getValues() const");
}

Assistant:

std::vector<StringRef> getValues() const {
    std::vector<StringRef> result;
    for (uint64_t i = 0; i < size;) {
      auto value = StringRef(&contents[i]);
      assert(i + value.size() <= size);
      result.push_back(value);
      i += value.size() + 1;
    }
    return result;
  }